

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O2

void __thiscall QHostInfoRunnable::~QHostInfoRunnable(QHostInfoRunnable *this)

{
  *(undefined ***)this = &PTR_run_002cab70;
  QHostInfoResult::~QHostInfoResult(&this->resultEmitter);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->toBeLookedUp).d);
  QRunnable::~QRunnable(&this->super_QRunnable);
  return;
}

Assistant:

QHostInfoRunnable::~QHostInfoRunnable()
    = default;